

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

QStringList * parseIfMatch(QByteArrayView raw)

{
  long lVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parseMatchImpl<parseIfMatch(QByteArrayView)::__0>(in_RDI,in_RSI,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QStringList parseIfMatch(QByteArrayView raw)
{
    return parseMatchImpl(raw, [](QByteArrayView element) {
        return element.startsWith('"') && element.endsWith('"');
    });
}